

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

int __thiscall
ON_HistoryRecord::GetBoolValues(ON_HistoryRecord *this,int value_id,ON_SimpleArray<bool> *a)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_BoolValue *v;
  ON_SimpleArray<bool> *a_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  ON_SimpleArray<bool>::SetCount(a,0);
  pOVar2 = FindValueHelper(this,value_id,1,false);
  if (pOVar2 != (ON_Value *)0x0) {
    ON_SimpleArray<bool>::operator=(a,(ON_SimpleArray<bool> *)(pOVar2 + 1));
  }
  iVar1 = ON_SimpleArray<bool>::Count(a);
  return iVar1;
}

Assistant:

int ON_HistoryRecord::GetBoolValues( int value_id, ON_SimpleArray<bool>& a ) const
{
  a.SetCount(0);
  const ON_BoolValue* v = static_cast<ON_BoolValue*>(FindValueHelper(value_id,ON_Value::bool_value,0));
  if ( v )
  {
    a = v->m_value;
  }
  return a.Count();
}